

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.c
# Opt level: O2

deSocketResult deSocket_receive(deSocket *sock,void *buf,size_t bufSize,size_t *numReceivedPtr)

{
  deUint32 channels;
  deSocketResult dVar1;
  ssize_t sVar2;
  size_t sVar3;
  int numBytes;
  
  sVar2 = recv(sock->handle,buf,bufSize,0);
  numBytes = (int)sVar2;
  dVar1 = mapSendRecvResult(numBytes);
  if (numReceivedPtr != (size_t *)0x0) {
    sVar3 = 0;
    if (0 < numBytes) {
      sVar3 = (long)numBytes;
    }
    *numReceivedPtr = sVar3;
  }
  if (dVar1 == DE_SOCKETRESULT_CONNECTION_CLOSED) {
    channels = 1;
  }
  else {
    if (dVar1 != DE_SOCKETRESULT_CONNECTION_TERMINATED) {
      return dVar1;
    }
    channels = 3;
  }
  deSocket_setChannelsClosed(sock,channels);
  return dVar1;
}

Assistant:

deSocketResult deSocket_receive (deSocket* sock, void* buf, size_t bufSize, size_t* numReceivedPtr)
{
	int				numRecv	= (int)recv(sock->handle, (char*)buf, (NativeSize)bufSize, 0);
	deSocketResult	result	= mapSendRecvResult(numRecv);

	if (numReceivedPtr)
		*numReceivedPtr = (numRecv > 0) ? ((size_t)numRecv) : (0);

	/* Update state. */
	if (result == DE_SOCKETRESULT_CONNECTION_CLOSED)
		deSocket_setChannelsClosed(sock, DE_SOCKETCHANNEL_RECEIVE);
	else if (result == DE_SOCKETRESULT_CONNECTION_TERMINATED)
		deSocket_setChannelsClosed(sock, DE_SOCKETCHANNEL_BOTH);

	return result;
}